

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O3

shared_ptr<JSONHandler> make_all_handler(void)

{
  JSONHandler *pJVar1;
  string msg;
  string msg_00;
  string msg_01;
  string msg_02;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *extraout_RAX_06;
  element_type *extraout_RAX_07;
  element_type *extraout_RAX_08;
  element_type *extraout_RAX_09;
  element_type *extraout_RAX_10;
  element_type *extraout_RAX_11;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  JSONHandler **in_RDI;
  shared_ptr<JSONHandler> sVar4;
  shared_ptr<JSONHandler> h5;
  shared_ptr<JSONHandler> h6ab;
  shared_ptr<JSONHandler> h6a;
  shared_ptr<JSONHandler> h6;
  shared_ptr<JSONHandler> h4;
  shared_ptr<JSONHandler> h5s;
  shared_ptr<JSONHandler> h6ax;
  shared_ptr<JSONHandler> h3;
  shared_ptr<JSONHandler> h2;
  shared_ptr<JSONHandler> h1;
  _Alloc_hider in_stack_fffffffffffffb98;
  _Alloc_hider _Var5;
  size_type in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  JSONHandler *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  JSONHandler *local_438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_430;
  JSONHandler *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  JSONHandler *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  JSONHandler *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  JSONHandler *local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  JSONHandler *local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  JSONHandler *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  JSONHandler *local_3c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  JSONHandler *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  shared_ptr<JSONHandler> local_3a8;
  shared_ptr<JSONHandler> local_398;
  shared_ptr<JSONHandler> local_388;
  shared_ptr<JSONHandler> local_378;
  shared_ptr<JSONHandler> local_368;
  shared_ptr<JSONHandler> local_358;
  shared_ptr<JSONHandler> local_348;
  shared_ptr<JSONHandler> local_338;
  shared_ptr<JSONHandler> local_328;
  shared_ptr<JSONHandler> local_318;
  shared_ptr<JSONHandler> local_308;
  shared_ptr<JSONHandler> local_2f8;
  shared_ptr<JSONHandler> local_2e8;
  json_handler_t local_2d8;
  json_handler_t local_2b8;
  json_handler_t local_298;
  json_handler_t local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_258;
  long *local_250 [2];
  long local_240 [2];
  long *local_230 [2];
  long local_220 [2];
  long *local_210 [2];
  long local_200 [2];
  long *local_1f0 [2];
  long local_1e0 [2];
  _Any_data local_1d0;
  code *local_1c0;
  _Any_data local_1b0;
  code *local_1a0;
  _Any_data local_190;
  code *local_180;
  _Any_data local_170;
  code *local_160;
  string_handler_t local_150;
  json_handler_t local_130;
  void_handler_t local_110;
  string_handler_t local_f0;
  bool_handler_t local_d0;
  json_handler_t local_b0;
  bool_handler_t local_90;
  string_handler_t local_70;
  string_handler_t local_50;
  
  *in_RDI = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 1),in_RDI,
             (allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  pJVar1 = *in_RDI;
  local_278.super__Function_base._M_functor._8_8_ = 0;
  local_278.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_278._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_278.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_258 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 1);
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"dict end","");
  msg._M_string_length = in_stack_fffffffffffffba0;
  msg._M_dataplus._M_p = in_stack_fffffffffffffb98._M_p;
  msg.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  msg.field_2._8_8_ = in_stack_fffffffffffffbb0;
  make_print_message((void_handler_t *)&local_170,msg);
  JSONHandler::addDictHandlers(pJVar1,&local_278,(void_handler_t *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  if (local_278.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.super__Function_base._M_manager)
              ((_Any_data *)&local_278,(_Any_data *)&local_278,__destroy_functor);
  }
  local_3b8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3b0,&local_3b8,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_50._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_3b8,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"one","");
  local_2e8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3b8;
  local_2e8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3b0._M_pi;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b0._M_pi)->_M_use_count = (local_3b0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_2e8);
  if (local_2e8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_3c8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3c0,&local_3c8,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object = print_number;
  local_70._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNumberHandler(local_3c8,&local_70);
  if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.super__Function_base._M_manager)
              ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"two","");
  local_2f8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3c8;
  local_2f8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3c0._M_pi;
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3c0._M_pi)->_M_use_count = (local_3c0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_2f8);
  if (local_2f8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_3d8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3d0,&local_3d8,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_90._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_90.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_3d8,&local_90);
  if (local_90.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.super__Function_base._M_manager)
              ((_Any_data *)&local_90,(_Any_data *)&local_90,__destroy_functor);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"three","");
  local_308.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3d8;
  local_308.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3d0._M_pi;
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3d0._M_pi)->_M_use_count = (local_3d0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_308);
  if (local_308.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_408 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_400,&local_408,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_b0.super__Function_base._M_functor._8_8_ = 0;
  local_b0.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_b0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_b0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_408,&local_b0);
  if (local_b0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.super__Function_base._M_manager)
              ((_Any_data *)&local_b0,(_Any_data *)&local_b0,__destroy_functor);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"four","");
  local_318.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_408;
  local_318.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_400._M_pi;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_318);
  if (local_318.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"phour","");
  local_328.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_408;
  local_328.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_400._M_pi;
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_328);
  if (local_328.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_448 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_440,&local_448,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_d0.super__Function_base._M_functor._8_8_ = 0;
  local_d0.super__Function_base._M_functor._M_unused._M_object = print_bool;
  local_d0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_invoke;
  local_d0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
       ::_M_manager;
  JSONHandler::addBoolHandler(local_448,&local_d0);
  if (local_d0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d0.super__Function_base._M_manager)
              ((_Any_data *)&local_d0,(_Any_data *)&local_d0,__destroy_functor);
  }
  local_f0.super__Function_base._M_functor._8_8_ = 0;
  local_f0.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_f0._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_f0.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_448,&local_f0);
  if (local_f0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f0.super__Function_base._M_manager)
              ((_Any_data *)&local_f0,(_Any_data *)&local_f0,__destroy_functor);
  }
  local_110.super__Function_base._M_functor._8_8_ = 0;
  local_110.super__Function_base._M_functor._M_unused._M_object = print_null;
  local_110._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_110.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addNullHandler(local_448,&local_110);
  if (local_110.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_110.super__Function_base._M_manager)
              ((_Any_data *)&local_110,(_Any_data *)&local_110,__destroy_functor);
  }
  local_3f8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3f0,&local_3f8,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"five","");
  local_338.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3f8;
  local_338.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3f0._M_pi;
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3f0._M_pi)->_M_use_count = (local_3f0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_338);
  if (local_338.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  pJVar1 = local_3f8;
  local_298.super__Function_base._M_functor._8_8_ = 0;
  local_298.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_298._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_298.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"array end","");
  msg_00._M_string_length = in_stack_fffffffffffffba0;
  msg_00._M_dataplus._M_p = _Var5._M_p;
  msg_00.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  msg_00.field_2._8_8_ = in_stack_fffffffffffffbb0;
  make_print_message((void_handler_t *)&local_190,msg_00);
  local_348.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_448;
  local_348.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_440._M_pi;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addArrayHandlers(pJVar1,&local_298,(void_handler_t *)&local_190,&local_348);
  if (local_348.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_180 != (code *)0x0) {
    (*local_180)(&local_190,&local_190,__destroy_functor);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  if (local_298.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_298.super__Function_base._M_manager)
              ((_Any_data *)&local_298,(_Any_data *)&local_298,__destroy_functor);
  }
  local_358.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_448;
  local_358.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_440._M_pi;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_440._M_pi)->_M_use_count = (local_440._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addFallbackHandler(local_3f8,&local_358);
  if (local_358.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_418 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_410,&local_418,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  pJVar1 = local_418;
  local_2b8.super__Function_base._M_functor._8_8_ = 0;
  local_2b8.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_2b8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_2b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"dict end","");
  msg_01._M_string_length = in_stack_fffffffffffffba0;
  msg_01._M_dataplus._M_p = _Var5._M_p;
  msg_01.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  msg_01.field_2._8_8_ = in_stack_fffffffffffffbb0;
  make_print_message((void_handler_t *)&local_1b0,msg_01);
  JSONHandler::addDictHandlers(pJVar1,&local_2b8,(void_handler_t *)&local_1b0);
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
  }
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if (local_2b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2b8.super__Function_base._M_manager)
              ((_Any_data *)&local_2b8,(_Any_data *)&local_2b8,__destroy_functor);
  }
  local_428 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_420,&local_428,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  pJVar1 = local_418;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"a","");
  local_368.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_428;
  local_368.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_420._M_pi;
  if (local_420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_420._M_pi)->_M_use_count = (local_420._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_420._M_pi)->_M_use_count = (local_420._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_368);
  if (local_368.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_368.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  pJVar1 = local_428;
  local_2d8.super__Function_base._M_functor._8_8_ = 0;
  local_2d8.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_2d8._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_2d8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"dict end","");
  msg_02._M_string_length = in_stack_fffffffffffffba0;
  msg_02._M_dataplus._M_p = _Var5._M_p;
  msg_02.field_2._M_allocated_capacity = in_stack_fffffffffffffba8;
  msg_02.field_2._8_8_ = in_stack_fffffffffffffbb0;
  make_print_message((void_handler_t *)&local_1d0,msg_02);
  JSONHandler::addDictHandlers(pJVar1,&local_2d8,(void_handler_t *)&local_1d0);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  if (local_2d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2d8.super__Function_base._M_manager)
              ((_Any_data *)&local_2d8,(_Any_data *)&local_2d8,__destroy_functor);
  }
  local_438 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_430,&local_438,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  pJVar1 = local_428;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"b","");
  local_378.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_438;
  local_378.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_430._M_pi;
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_378);
  if (local_378.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_3e8 = (JSONHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<JSONHandler,std::allocator<JSONHandler>>
            (&local_3e0,&local_3e8,(allocator<JSONHandler> *)&stack0xfffffffffffffb98);
  local_130.super__Function_base._M_functor._8_8_ = 0;
  local_130.super__Function_base._M_functor._M_unused._M_object = print_json;
  local_130._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_invoke;
  local_130.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
       ::_M_manager;
  JSONHandler::addAnyHandler(local_3e8,&local_130);
  if (local_130.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_130.super__Function_base._M_manager)
              ((_Any_data *)&local_130,(_Any_data *)&local_130,__destroy_functor);
  }
  local_388.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_3e8;
  local_388.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_3e0._M_pi;
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3e0._M_pi)->_M_use_count = (local_3e0._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addFallbackDictHandler(local_428,&local_388);
  if (local_388.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pJVar1 = local_418;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"b","");
  local_398.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_438;
  local_398.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_430._M_pi;
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_430._M_pi)->_M_use_count = (local_430._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_398);
  if (local_398.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
  }
  local_150.super__Function_base._M_functor._8_8_ = 0;
  local_150.super__Function_base._M_functor._M_unused._M_object = print_string;
  local_150._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_150.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  JSONHandler::addStringHandler(local_438,&local_150);
  if (local_150.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.super__Function_base._M_manager)
              ((_Any_data *)&local_150,(_Any_data *)&local_150,__destroy_functor);
  }
  pJVar1 = *in_RDI;
  _Var5._M_p = &stack0xfffffffffffffba8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffb98,"six","");
  local_3a8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_418;
  local_3a8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_410._M_pi;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
    }
  }
  JSONHandler::addDictKeyHandler(pJVar1,(string *)&stack0xfffffffffffffb98,&local_3a8);
  peVar2 = extraout_RAX;
  _Var3._M_pi = extraout_RDX;
  if (local_3a8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    peVar2 = extraout_RAX_00;
    _Var3._M_pi = extraout_RDX_00;
  }
  if (_Var5._M_p != &stack0xfffffffffffffba8) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffba8 + 1);
    peVar2 = extraout_RAX_01;
    _Var3._M_pi = extraout_RDX_01;
  }
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0._M_pi);
    peVar2 = extraout_RAX_02;
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_430._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430._M_pi);
    peVar2 = extraout_RAX_03;
    _Var3._M_pi = extraout_RDX_03;
  }
  if (local_420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_420._M_pi);
    peVar2 = extraout_RAX_04;
    _Var3._M_pi = extraout_RDX_04;
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
    peVar2 = extraout_RAX_05;
    _Var3._M_pi = extraout_RDX_05;
  }
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0._M_pi);
    peVar2 = extraout_RAX_06;
    _Var3._M_pi = extraout_RDX_06;
  }
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
    peVar2 = extraout_RAX_07;
    _Var3._M_pi = extraout_RDX_07;
  }
  if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
    peVar2 = extraout_RAX_08;
    _Var3._M_pi = extraout_RDX_08;
  }
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
    peVar2 = extraout_RAX_09;
    _Var3._M_pi = extraout_RDX_09;
  }
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
    peVar2 = extraout_RAX_10;
    _Var3._M_pi = extraout_RDX_10;
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
    peVar2 = extraout_RAX_11;
    _Var3._M_pi = extraout_RDX_11;
  }
  sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (shared_ptr<JSONHandler>)sVar4.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<JSONHandler>
make_all_handler()
{
    auto h = std::make_shared<JSONHandler>();
    h->addDictHandlers(print_json, make_print_message("dict end"));
    auto h1 = std::make_shared<JSONHandler>();
    h1->addStringHandler(print_string);
    h->addDictKeyHandler("one", h1);
    auto h2 = std::make_shared<JSONHandler>();
    h2->addNumberHandler(print_number);
    h->addDictKeyHandler("two", h2);
    auto h3 = std::make_shared<JSONHandler>();
    h3->addBoolHandler(print_bool);
    h->addDictKeyHandler("three", h3);
    auto h4 = std::make_shared<JSONHandler>();
    h4->addAnyHandler(print_json);
    h->addDictKeyHandler("four", h4);
    h->addDictKeyHandler("phour", h4); // share h4
    auto h5 = std::make_shared<JSONHandler>();
    // Allow to be either string or bool
    h5->addBoolHandler(print_bool);
    h5->addStringHandler(print_string);
    h5->addNullHandler(print_null);
    auto h5s = std::make_shared<JSONHandler>();
    h->addDictKeyHandler("five", h5s);
    h5s->addArrayHandlers(print_json, make_print_message("array end"), h5);
    h5s->addFallbackHandler(h5);
    auto h6 = std::make_shared<JSONHandler>();
    h6->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6a = std::make_shared<JSONHandler>();
    h6->addDictKeyHandler("a", h6a);
    h6a->addDictHandlers(print_json, make_print_message("dict end"));
    auto h6ab = std::make_shared<JSONHandler>();
    h6a->addDictKeyHandler("b", h6ab);
    auto h6ax = std::make_shared<JSONHandler>();
    h6ax->addAnyHandler(print_json);
    h6a->addFallbackDictHandler(h6ax);
    h6->addDictKeyHandler("b", h6ab); // share
    h6ab->addStringHandler(print_string);
    h->addDictKeyHandler("six", h6);
    return h;
}